

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jkGetF0.cc
# Opt level: O0

void sptk::snack::peak(float *y,float *xp,float *yp)

{
  float fVar1;
  float fVar2;
  float *in_RDX;
  float *in_RSI;
  float *in_RDI;
  double dVar3;
  float c;
  float a;
  
  fVar1 = (*in_RDI - in_RDI[2]) * 0.5 + (in_RDI[2] - in_RDI[1]);
  dVar3 = std::fabs((double)(ulong)(uint)fVar1);
  if (SUB84(dVar3,0) <= 1e-06) {
    *in_RSI = 0.0;
    *in_RDX = in_RDI[1];
  }
  else {
    fVar2 = (*in_RDI - in_RDI[2]) / (fVar1 * 4.0);
    *in_RSI = fVar2;
    *in_RDX = -(fVar1 * fVar2) * fVar2 + in_RDI[1];
  }
  return;
}

Assistant:

static void peak(float *y, float *xp, float *yp)
#endif
{
  register float a, c;
  
  a = (float)((y[2]-y[1])+(.5*(y[0]-y[2])));
  if(fabs(a) > .000001) {
    *xp = c = (float)((y[0]-y[2])/(4.0*a));
    *yp = y[1] - (a*c*c);
  } else {
    *xp = 0.0;
    *yp = y[1];
  }
}